

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall
xLearn::DMatrix::Compress
          (DMatrix *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *feature_list)

{
  bool bVar1;
  reference ppvVar2;
  reference ppvVar3;
  size_type sVar4;
  ulong uVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  reference pNVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar9;
  Node *iter_1;
  iterator __end3;
  iterator __begin3;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *__range3;
  index_t i_2;
  index_t i_1;
  feature_map mp;
  iterator iter;
  SparseRow *row_1;
  index_t i;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  feat_set;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *row;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  *__range2;
  size_t node_num;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  mapped_type in_stack_fffffffffffffe54;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe60;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe68;
  _Node_iterator_base<unsigned_int,_false> in_stack_fffffffffffffe70;
  _Node_iterator_base<unsigned_int,_false> in_stack_fffffffffffffe78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe80;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_128;
  value_type local_120;
  uint local_118;
  uint local_114;
  uint *local_d8;
  uint *local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c0;
  _Node_iterator_base<unsigned_int,_false> local_b8;
  _Node_iterator_base<unsigned_int,_false> local_b0;
  _Node_iterator_base<unsigned_int,_false> local_a8;
  undefined1 local_a0;
  Node *local_98;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_90;
  value_type local_88;
  uint local_80;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *local_38;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> **local_30;
  __normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
  local_28;
  long local_20;
  long local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_18 = 0;
  local_20 = in_RDI + 0x18;
  local_10 = in_RSI;
  local_28._M_current =
       (vector<xLearn::Node,_std::allocator<xLearn::Node>_> **)
       std::
       vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
       ::begin((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                *)in_stack_fffffffffffffe48);
  local_30 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> **)
             std::
             vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ::end((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                    *)in_stack_fffffffffffffe48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (__normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
              ::operator*(&local_28);
    local_38 = *ppvVar2;
    sVar6 = std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::size(local_38);
    local_18 = sVar6 + local_18;
    __gnu_cxx::
    __normal_iterator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_**,_std::vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>_>
    ::operator++(&local_28);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)0x210857);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::reserve((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
            (size_type)in_stack_fffffffffffffe48);
  for (local_80 = 0; local_80 < *(uint *)(in_RDI + 0x10); local_80 = local_80 + 1) {
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RDI + 0x18),(ulong)local_80);
    local_88 = *ppvVar3;
    local_90._M_current =
         (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                           ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                            in_stack_fffffffffffffe48);
    while( true ) {
      local_98 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                   ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                                    in_stack_fffffffffffffe48);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffe48);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_90);
      sVar4 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      (key_type *)in_stack_fffffffffffffe48);
      if (sVar4 == 0) {
        __gnu_cxx::
        __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator->(&local_90);
        pVar9 = std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)in_stack_fffffffffffffe60._M_current,
                         in_stack_fffffffffffffe58._M_current);
        local_a8._M_cur =
             (__node_type *)pVar9.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_a0 = pVar9.second;
      }
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++(&local_90);
    }
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::size((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *)0x2109cd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78._M_cur);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::begin(in_stack_fffffffffffffe48);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(in_stack_fffffffffffffe48);
  local_c0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffe48);
  local_c8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             copy<std::__detail::_Node_iterator<unsigned_int,true,false>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       ((_Node_iterator<unsigned_int,_true,_false>)in_stack_fffffffffffffe78._M_cur,
                        (_Node_iterator<unsigned_int,_true,_false>)in_stack_fffffffffffffe70._M_cur,
                        in_stack_fffffffffffffe68);
  local_d0 = (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffffe48);
  local_d8 = (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffffe48);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)0x210ac5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_10);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::reserve((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
            (size_type)in_stack_fffffffffffffe48);
  local_114 = 0;
  while( true ) {
    uVar5 = (ulong)local_114;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_10);
    if (sVar6 <= uVar5) break;
    in_stack_fffffffffffffe54 = local_114 + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_10,(ulong)local_114);
    pmVar7 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (key_type *)in_stack_fffffffffffffe48);
    *pmVar7 = in_stack_fffffffffffffe54;
    local_114 = local_114 + 1;
  }
  for (local_118 = 0; local_118 < *(uint *)(in_RDI + 0x10); local_118 = local_118 + 1) {
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RDI + 0x18),(ulong)local_118);
    local_120 = *ppvVar3;
    local_128._M_current =
         (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                           ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                            in_stack_fffffffffffffe48);
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)in_stack_fffffffffffffe48);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffe48);
      if (!bVar1) break;
      pNVar8 = __gnu_cxx::
               __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator*(&local_128);
      in_stack_fffffffffffffe48 =
           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            *)std::
              unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (key_type *)in_stack_fffffffffffffe48);
      pNVar8->feat_id = *(index_t *)&(in_stack_fffffffffffffe48->_M_h)._M_buckets;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++(&local_128);
    }
  }
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)0x210c8b);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)0x210c98);
  return;
}

Assistant:

void Compress(std::vector<index_t>& feature_list) {
    // Using a map to store the mapping relations
    size_t node_num {0};
    for (auto row : this->row) {
      node_num += row->size();
    }
    std::unordered_set<index_t> feat_set;
    feat_set.reserve(node_num);
    for (index_t i = 0; i < this->row_length; ++i) {
      SparseRow* row = this->row[i];
      for (SparseRow::iterator iter = row->begin();
           iter != row->end(); ++iter) {
        if (feat_set.count(iter->feat_id) == 0) {
          feat_set.insert(iter->feat_id);
        }
      }
    }
    feature_list.reserve(feat_set.size());
    std::copy(feat_set.begin(), feat_set.end(), 
              std::back_inserter(feature_list));
    std::sort(begin(feature_list), end(feature_list));
    feature_map mp;
    mp.reserve(feature_list.size());
    for (index_t i = 0; i < feature_list.size(); ++ i) {
      mp[feature_list[i]] = i + 1;
    }
    for (index_t i = 0; i < this->row_length; ++ i) {
      for (auto &iter: *this->row[i]) {
        // using map is better than lower_bound
        iter.feat_id = mp[iter.feat_id];
      }
    }
  }